

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O0

_Bool simulate(Windows *gameInterface,UnitList *guardList,UnitList *inmateList,Path *path)

{
  int iVar1;
  WINDOW *pWVar2;
  Inmate *inmate;
  long lVar3;
  undefined8 uStack_70;
  long local_68;
  int local_60;
  int local_5c;
  int i_1;
  int i;
  timespec delay;
  unsigned_long __vla_expr0;
  float local_34;
  UnitNode *pUStack_30;
  float simulateTime;
  UnitNode *nextInmate;
  Path *path_local;
  UnitList *inmateList_local;
  UnitList *guardList_local;
  Windows *gameInterface_local;
  
  local_34 = 0.0;
  delay.tv_nsec = (__syscall_slong_t)(uint)inmateList->count;
  lVar3 = -(delay.tv_nsec * 4 + 0xfU & 0xfffffffffffffff0);
  local_68 = (long)&local_68 + lVar3;
  _i_1 = 0;
  delay.tv_sec = 50000000;
  while (local_34 < 40.0) {
    *(undefined8 *)((long)&uStack_70 + lVar3) = 0x105675;
    pUStack_30 = getHead(inmateList);
    for (local_5c = 0; local_5c < inmateList->count; local_5c = local_5c + 1) {
      *(int *)(local_68 + (long)local_5c * 4) = (int)*(float *)((long)pUStack_30->unit + 4);
      pUStack_30 = pUStack_30->next;
    }
    *(undefined8 *)((long)&uStack_70 + lVar3) = 0x1056c7;
    inmateMove(inmateList,path);
    *(undefined8 *)((long)&uStack_70 + lVar3) = 0x1056d0;
    pUStack_30 = getHead(inmateList);
    for (local_60 = 0; local_60 < inmateList->count; local_60 = local_60 + 1) {
      if ((*pUStack_30->unit & 1) == 0) {
        pWVar2 = gameInterface->body;
        inmate = (Inmate *)pUStack_30->unit;
        iVar1 = *(int *)(local_68 + (long)local_60 * 4);
        *(undefined8 *)((long)&uStack_70 + lVar3) = 0x10571f;
        redrawUnit(pWVar2,inmate,path,(float)iVar1);
      }
      else {
        *(undefined8 *)((long)&uStack_70 + lVar3) = 0x10572a;
        dequeue(inmateList);
      }
      pUStack_30 = pUStack_30->next;
    }
    local_34 = local_34 + 0.25;
    pWVar2 = gameInterface->body;
    *(undefined8 *)((long)&uStack_70 + lVar3) = 0x10576c;
    wrefresh(pWVar2);
    *(undefined8 *)((long)&uStack_70 + lVar3) = 0x105779;
    nanosleep((timespec *)&i_1,(timespec *)0x0);
  }
  return true;
}

Assistant:

bool simulate(struct Windows *gameInterface,
    struct UnitList *guardList, struct UnitList *inmateList,
    struct Path *path) {

    struct UnitNode *nextInmate;
    float simulateTime = 0;
    int prevPos[inmateList->count];
    struct timespec delay;

    delay.tv_sec = 0;
    delay.tv_nsec = 50000000L;  // Half second in nano seconds

    while (simulateTime < 40) {

        nextInmate = getHead(inmateList);
        for (int i = 0; i < inmateList->count; i++) {
            prevPos[i] = ((struct Inmate *) nextInmate->unit)->position;
            nextInmate = nextInmate->next;
        }

        inmateMove(inmateList, path);
        //guardAttack(guardList, inmateList);
        nextInmate = getHead(inmateList);

        for (int i = 0; i < inmateList->count; i++) {
            if (((struct Inmate *) nextInmate->unit)->delUnit == FALSE)
                redrawUnit(gameInterface->body,
                    (struct Inmate *) nextInmate->unit, path, prevPos[i]);
            else {
                /*Call redraw but delete it?, or simply call eraseUnit in UI*/
                dequeue(inmateList);
            }
            nextInmate = nextInmate->next;
        }
        simulateTime += .25;
        wrefresh(gameInterface->body);
        nanosleep(&delay, NULL);
    }

    return true;  //TODO return win condition

}